

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O0

ui_entry_iterator *
initialize_ui_entry_iterator(ui_entry_predicate predicate,void *closure,char *sortcategory)

{
  _Bool _Var1;
  ui_entry_iterator *puVar2;
  ui_entry **ppuVar3;
  wchar_t local_2c;
  wchar_t i;
  ui_entry_iterator *result;
  char *sortcategory_local;
  void *closure_local;
  ui_entry_predicate predicate_local;
  
  puVar2 = (ui_entry_iterator *)mem_alloc(0x10);
  ppuVar3 = (ui_entry **)mem_alloc((long)n_entry << 3);
  puVar2->entries = ppuVar3;
  puVar2->n = L'\0';
  puVar2->i = L'\0';
  for (local_2c = L'\0'; local_2c < n_entry; local_2c = local_2c + L'\x01') {
    if (((entries[local_2c]->flags & 0x100000U) == 0) &&
       (_Var1 = (*predicate)(entries[local_2c],closure), _Var1)) {
      puVar2->entries[puVar2->n] = entries[local_2c];
      puVar2->n = puVar2->n + L'\x01';
    }
  }
  category_for_cmp_desc_prio = sortcategory;
  sort(puVar2->entries,(long)puVar2->n,8,cmp_desc_prio);
  return puVar2;
}

Assistant:

struct ui_entry_iterator *initialize_ui_entry_iterator(
	ui_entry_predicate predicate, void *closure, const char *sortcategory)
{
	struct ui_entry_iterator *result = mem_alloc(sizeof(*result));
	int i;

	result->entries = mem_alloc(n_entry * sizeof(*result->entries));
	result->n = 0;
	result->i = 0;
	for (i = 0; i < n_entry; ++i) {
		if (! (entries[i]->flags & ENTRY_FLAG_TEMPLATE_ONLY) &&
			(*predicate)(entries[i], closure)) {
			result->entries[result->n] = entries[i];
			++result->n;
		}
	}
	category_for_cmp_desc_prio = sortcategory;
	sort(result->entries, result->n, sizeof(*result->entries),
		cmp_desc_prio);
	return result;
}